

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

double fas154(double *b,int pq,void *params)

{
  size_t __size;
  uint ip;
  double *phi;
  double *theta;
  double *V;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  double local_68;
  double ssq;
  double sumlog;
  int local_50;
  int local_4c;
  int nit;
  int iter;
  ulong local_40;
  double *local_38;
  
  ssq = 0.0;
  local_68 = 0.0;
  ip = *params;
  local_40 = (ulong)*(int *)((long)params + 8);
  iVar5 = *(int *)((long)params + 0xc);
  lVar7 = (long)iVar5;
  sumlog = (double)(long)*(int *)((long)params + 0x18);
  _nit = (double *)CONCAT44(iter,((iVar5 + 1) * iVar5) / 2);
  __size = lVar7 * 8;
  phi = (double *)malloc(__size);
  theta = (double *)malloc(__size);
  local_38 = (double *)malloc(__size);
  lVar4 = (long)nit;
  _nit = (double *)malloc(lVar4 << 3);
  V = (double *)malloc(lVar4 << 3);
  uVar3 = 0;
  uVar1 = 0;
  if (0 < (int)ip) {
    uVar1 = (ulong)ip;
  }
  for (; lVar4 = (long)(int)ip, uVar1 != uVar3; uVar3 = uVar3 + 1) {
    phi[uVar3] = b[uVar3];
  }
  for (; lVar4 < lVar7; lVar4 = lVar4 + 1) {
    phi[lVar4] = 0.0;
  }
  uVar3 = 0;
  iVar5 = (int)local_40;
  uVar1 = 0;
  if (0 < iVar5) {
    uVar1 = local_40 & 0xffffffff;
  }
  for (; uVar2 = local_40, uVar1 != uVar3; uVar3 = uVar3 + 1) {
    theta[uVar3] = b[(long)(int)ip + uVar3];
  }
  for (; (long)uVar2 < lVar7; uVar2 = uVar2 + 1) {
    theta[uVar2] = 0.0;
  }
  if (*(int *)((long)params + 0x1c) == 1) {
    pdVar6 = (double *)((long)params + 0x680);
    uVar1 = 0;
    if (0 < SUB84(sumlog,0)) {
      uVar1 = (ulong)sumlog & 0xffffffff;
    }
    while (bVar8 = uVar1 != 0, uVar1 = uVar1 - 1, bVar8) {
      *pdVar6 = pdVar6[SUB84(sumlog,0) * 2] - b[(int)(iVar5 + ip)];
      pdVar6 = pdVar6 + 1;
    }
  }
  bVar8 = ip != 1 || iVar5 != 0;
  if (bVar8) {
    starma(ip,iVar5,phi,theta,local_38,_nit,V);
    dVar9 = extraout_XMM0_Qa;
  }
  else {
    *V = 1.0;
    *local_38 = 0.0;
    dVar9 = *phi * *phi;
    *_nit = 1.0 / (1.0 - dVar9);
  }
  pdVar6 = local_38;
  local_40 = (ulong)bVar8;
  local_50 = 0;
  karma(ip,iVar5,phi,&local_68,local_38,_nit,V,SUB84(sumlog,0),(double *)((long)params + 0x680),
        (double *)((long)params + (long)sumlog * 8 + 0x680),&ssq,&local_68,(uint)bVar8,dVar9,
        &local_4c,&local_50);
  *(double *)((long)params + 0x30) = local_68;
  local_38 = (double *)(ssq / (double)local_4c);
  dVar9 = log(local_68 / (double)local_4c);
  local_38 = (double *)((dVar9 + (double)local_38) * 0.5);
  *(double **)((long)params + 0x38) = local_38;
  free(phi);
  free(theta);
  free(pdVar6);
  free(_nit);
  free(V);
  return (double)local_38;
}

Assistant:

double fas154(double *b,int pq,void *params) {
	double value,ssq,sumlog,delta;
	int ip, iq, ir,i,np,ifault,N,iupd,nit,iter;
	double *phi, *theta, *A,*P,*V;

	value = ssq = sumlog = 0.0;
	alik_object obj = (alik_object)params;

	ip = obj->p;
	iq = obj->q;
	ir = obj->r;
	N = obj->N;
	np = (ir * (ir + 1)) / 2;

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);
	//bt = (double*)malloc(sizeof(double)* (ip+iq));
	/*
	for (i = 0; i < ip + iq; ++i) {
		bt[i] = b[i];
	}

	pdlreg(ip, bt, b);
	pdlreg(iq, bt + ip, b + ip);
	*/
	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}
	for (i = ip; i < ir; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i+ip];
	}
	for (i = iq; i < ir; ++i) {
		theta[i] = 0.0;
	}
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip + iq];
		}
	}

	iupd = 0;

	if (ip == 1 && iq == 0) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}
	
	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x, obj->x + N, &sumlog, &ssq, iupd, delta,&iter, &nit);
	obj->ssq = ssq;
	//mdisplay(phi, 1, ip);
	value = 0.5 * (sumlog/(double)iter + log(ssq/(double) iter));
	obj->loglik = value;

	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	//free(bt);
	return value;
}